

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

ZSTD_bounds ZSTD_cParam_getBounds(ZSTD_cParameter param)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  
  if ((int)param < 200) {
    switch(param) {
    case ZSTD_c_compressionLevel:
      uVar2 = 0x16fffe0000;
      break;
    case ZSTD_c_windowLog:
      uVar2 = 0x1f0000000a;
      break;
    case ZSTD_c_hashLog:
    case ZSTD_c_chainLog:
switchD_0010f9ee_caseD_66:
      uVar2 = 0x1e00000006;
      break;
    case ZSTD_c_searchLog:
      uVar2 = 0x1e00000001;
      break;
    case ZSTD_c_minMatch:
      uVar2 = 0x700000003;
      break;
    case ZSTD_c_targetLength:
      uVar2 = 0x2000000000000;
      break;
    case ZSTD_c_strategy:
      uVar2 = 0x900000001;
      break;
    default:
      switch(param) {
      case ZSTD_c_ldmHashLog:
        goto switchD_0010f9ee_caseD_66;
      case ZSTD_c_ldmMinMatch:
        uVar2 = 0x100000000004;
        break;
      case ZSTD_c_ldmBucketSizeLog:
        uVar2 = 0x800000001;
        break;
      case ZSTD_c_ldmHashRateLog:
        uVar2 = 0x1900000000;
        break;
      default:
        if (param != ZSTD_c_experimentalParam2) goto LAB_0010fac5;
      case ZSTD_c_enableLongDistanceMatching:
switchD_0010fa58_caseD_a0:
        uVar2 = 0x100000000;
      }
    }
  }
  else {
    if ((int)param < 0x192) {
      if ((int)param < 0xca) {
        if ((param != ZSTD_c_contentSizeFlag) && (param != ZSTD_c_checksumFlag)) {
LAB_0010fac5:
          return (ZSTD_bounds)ZEXT816(0xffffffffffffffd8);
        }
      }
      else if (param != ZSTD_c_dictIDFlag) {
        if (param == ZSTD_c_nbWorkers) {
          uVar2 = 0xc800000000;
        }
        else {
          if (param != ZSTD_c_jobSize) goto LAB_0010fac5;
          uVar2 = 0x4000000000000000;
        }
        goto LAB_0010faa7;
      }
      goto switchD_0010fa58_caseD_a0;
    }
    switch(param) {
    case ZSTD_c_experimentalParam3:
      goto switchD_0010fa58_caseD_a0;
    case ZSTD_c_experimentalParam4:
      uVar2 = 0x300000000;
      break;
    case ZSTD_c_experimentalParam5:
      uVar2 = 0x200000000;
      break;
    case ZSTD_c_experimentalParam6:
      uVar2 = 0x2000000000040;
      break;
    case ZSTD_c_experimentalParam7:
      uVar2 = 0x7fffffff00000000;
      break;
    default:
      if (param == ZSTD_c_overlapLog) {
        uVar2 = 0x900000000;
        break;
      }
      if (param != ZSTD_c_experimentalParam1) goto LAB_0010fac5;
      goto switchD_0010fa58_caseD_a0;
    }
  }
LAB_0010faa7:
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  return (ZSTD_bounds)(auVar1 << 0x40);
}

Assistant:

ZSTD_bounds ZSTD_cParam_getBounds(ZSTD_cParameter param)
{
    ZSTD_bounds bounds = { 0, 0, 0 };

    switch(param)
    {
    case ZSTD_c_compressionLevel:
        bounds.lowerBound = ZSTD_minCLevel();
        bounds.upperBound = ZSTD_maxCLevel();
        return bounds;

    case ZSTD_c_windowLog:
        bounds.lowerBound = ZSTD_WINDOWLOG_MIN;
        bounds.upperBound = ZSTD_WINDOWLOG_MAX;
        return bounds;

    case ZSTD_c_hashLog:
        bounds.lowerBound = ZSTD_HASHLOG_MIN;
        bounds.upperBound = ZSTD_HASHLOG_MAX;
        return bounds;

    case ZSTD_c_chainLog:
        bounds.lowerBound = ZSTD_CHAINLOG_MIN;
        bounds.upperBound = ZSTD_CHAINLOG_MAX;
        return bounds;

    case ZSTD_c_searchLog:
        bounds.lowerBound = ZSTD_SEARCHLOG_MIN;
        bounds.upperBound = ZSTD_SEARCHLOG_MAX;
        return bounds;

    case ZSTD_c_minMatch:
        bounds.lowerBound = ZSTD_MINMATCH_MIN;
        bounds.upperBound = ZSTD_MINMATCH_MAX;
        return bounds;

    case ZSTD_c_targetLength:
        bounds.lowerBound = ZSTD_TARGETLENGTH_MIN;
        bounds.upperBound = ZSTD_TARGETLENGTH_MAX;
        return bounds;

    case ZSTD_c_strategy:
        bounds.lowerBound = ZSTD_STRATEGY_MIN;
        bounds.upperBound = ZSTD_STRATEGY_MAX;
        return bounds;

    case ZSTD_c_contentSizeFlag:
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_checksumFlag:
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_dictIDFlag:
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_nbWorkers:
        bounds.lowerBound = 0;
#ifdef ZSTD_MULTITHREAD
        bounds.upperBound = ZSTDMT_NBWORKERS_MAX;
#else
        bounds.upperBound = 0;
#endif
        return bounds;

    case ZSTD_c_jobSize:
        bounds.lowerBound = 0;
#ifdef ZSTD_MULTITHREAD
        bounds.upperBound = ZSTDMT_JOBSIZE_MAX;
#else
        bounds.upperBound = 0;
#endif
        return bounds;

    case ZSTD_c_overlapLog:
#ifdef ZSTD_MULTITHREAD
        bounds.lowerBound = ZSTD_OVERLAPLOG_MIN;
        bounds.upperBound = ZSTD_OVERLAPLOG_MAX;
#else
        bounds.lowerBound = 0;
        bounds.upperBound = 0;
#endif
        return bounds;

    case ZSTD_c_enableLongDistanceMatching:
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_ldmHashLog:
        bounds.lowerBound = ZSTD_LDM_HASHLOG_MIN;
        bounds.upperBound = ZSTD_LDM_HASHLOG_MAX;
        return bounds;

    case ZSTD_c_ldmMinMatch:
        bounds.lowerBound = ZSTD_LDM_MINMATCH_MIN;
        bounds.upperBound = ZSTD_LDM_MINMATCH_MAX;
        return bounds;

    case ZSTD_c_ldmBucketSizeLog:
        bounds.lowerBound = ZSTD_LDM_BUCKETSIZELOG_MIN;
        bounds.upperBound = ZSTD_LDM_BUCKETSIZELOG_MAX;
        return bounds;

    case ZSTD_c_ldmHashRateLog:
        bounds.lowerBound = ZSTD_LDM_HASHRATELOG_MIN;
        bounds.upperBound = ZSTD_LDM_HASHRATELOG_MAX;
        return bounds;

    /* experimental parameters */
    case ZSTD_c_rsyncable:
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_forceMaxWindow :
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_format:
        ZSTD_STATIC_ASSERT(ZSTD_f_zstd1 < ZSTD_f_zstd1_magicless);
        bounds.lowerBound = ZSTD_f_zstd1;
        bounds.upperBound = ZSTD_f_zstd1_magicless;   /* note : how to ensure at compile time that this is the highest value enum ? */
        return bounds;

    case ZSTD_c_forceAttachDict:
        ZSTD_STATIC_ASSERT(ZSTD_dictDefaultAttach < ZSTD_dictForceCopy);
        bounds.lowerBound = ZSTD_dictDefaultAttach;
        bounds.upperBound = ZSTD_dictForceLoad;       /* note : how to ensure at compile time that this is the highest value enum ? */
        return bounds;

    case ZSTD_c_literalCompressionMode:
        ZSTD_STATIC_ASSERT(ZSTD_lcm_auto < ZSTD_lcm_huffman && ZSTD_lcm_huffman < ZSTD_lcm_uncompressed);
        bounds.lowerBound = ZSTD_lcm_auto;
        bounds.upperBound = ZSTD_lcm_uncompressed;
        return bounds;

    case ZSTD_c_targetCBlockSize:
        bounds.lowerBound = ZSTD_TARGETCBLOCKSIZE_MIN;
        bounds.upperBound = ZSTD_TARGETCBLOCKSIZE_MAX;
        return bounds;

    case ZSTD_c_srcSizeHint:
        bounds.lowerBound = ZSTD_SRCSIZEHINT_MIN;
        bounds.upperBound = ZSTD_SRCSIZEHINT_MAX;
        return bounds;

    default:
        {   ZSTD_bounds const boundError = { ERROR(parameter_unsupported), 0, 0 };
            return boundError;
        }
    }
}